

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcGetResultType(void)

{
  uint local_c;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    local_c = 0;
  }
  else if (NULLC::currExec == 1) {
    local_c = ExecutorX86::GetResultType(NULLC::executorX86);
  }
  else if (NULLC::currExec == 0) {
    local_c = ExecutorRegVm::GetResultType(NULLC::executorRegVm);
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

unsigned nullcGetResultType()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(NULLC_TYPE_VOID);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResultType();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResultType();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResultType();
#endif

	return NULLC_TYPE_VOID;
}